

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall
BackwardPass::ProcessStackSymUse(BackwardPass *this,StackSym *stackSym,BOOLEAN isNonByteCodeUse)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  Phase PVar5;
  RegSlot RVar6;
  StackSym *this_00;
  Func *pFVar7;
  undefined4 *puVar8;
  StackSym **ppSVar9;
  undefined7 in_register_00000011;
  TempObjectTracker *this_01;
  TempObjectVerifyTracker *this_02;
  
  pBVar1 = this->currentBlock;
  bVar3 = DoByteCodeUpwardExposedUsed(this);
  if (((int)CONCAT71(in_register_00000011,isNonByteCodeUse) == 0 && bVar3) &&
     ((*(uint *)&stackSym->field_0x18 >> 0xd & 1) != 0)) {
    this_00 = stackSym;
    if ((*(uint *)&stackSym->field_0x18 >> 0x10 & 1) != 0) {
      this_00 = StackSym::GetVarEquivSym(stackSym,(Func *)0x0);
    }
    BVSparse<Memory::JitArenaAllocator>::Set
              (pBVar1->byteCodeUpwardExposedUsed,(this_00->super_Sym).m_id);
    pFVar7 = StackSym::GetByteCodeFunc(this_00);
    if (pFVar7 == this->func) {
      RVar6 = StackSym::GetByteCodeRegSlot(this_00);
      ppSVar9 = pBVar1->byteCodeRestoreSyms;
      if (ppSVar9[RVar6] != this_00) {
        if (ppSVar9[RVar6] != (StackSym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x14cd,"(block->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr)",
                             "Can\'t have two active lifetime for the same byte code register");
          if (!bVar3) goto LAB_003e5d52;
          *puVar8 = 0;
          ppSVar9 = pBVar1->byteCodeRestoreSyms;
        }
        ppSVar9[RVar6] = this_00;
      }
    }
  }
  bVar3 = true;
  if (this->isCollectionPass == false) {
    PVar5 = this->tag;
    if (PVar5 == BackwardPhase) {
      bVar3 = SatisfyMarkTempObjectsConditions(this);
      if (bVar3) {
        this_01 = pBVar1->tempObjectTracker;
        if ((pBVar1->loop == (Loop *)0x0) ==
            ((this_01->super_ObjectTemp).super_TempTrackerBase.tempTransferDependencies !=
            (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x14e1,
                             "((block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies())"
                             ,
                             "(block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies()"
                            );
          if (!bVar3) goto LAB_003e5d52;
          *puVar8 = 0;
          this_01 = pBVar1->tempObjectTracker;
        }
        TempTracker<ObjectTemp>::ProcessUse(this_01,stackSym,this);
      }
      PVar5 = this->tag;
    }
    if (PVar5 == DeadStorePhase) {
      bVar3 = SatisfyMarkTempObjectsConditions(this);
      if (bVar3) {
        this_02 = pBVar1->tempObjectVerifyTracker;
        if ((pBVar1->loop == (Loop *)0x0) ==
            ((this_02->super_ObjectTempVerify).super_TempTrackerBase.tempTransferDependencies !=
            (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x14e7,
                             "((block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies())"
                             ,
                             "(block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies()"
                            );
          if (!bVar3) {
LAB_003e5d52:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
          this_02 = pBVar1->tempObjectVerifyTracker;
        }
        TempTracker<ObjectTempVerify>::ProcessUse(this_02,stackSym,this);
      }
    }
    BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                      (pBVar1->upwardExposedUses,(stackSym->super_Sym).m_id);
    bVar3 = BVar4 != '\0';
  }
  return bVar3;
}

Assistant:

bool
BackwardPass::ProcessStackSymUse(StackSym * stackSym, BOOLEAN isNonByteCodeUse)
{
    BasicBlock * block = this->currentBlock;

    if (this->DoByteCodeUpwardExposedUsed())
    {
        if (!isNonByteCodeUse && stackSym->HasByteCodeRegSlot())
        {
            // Always track the sym use on the var sym.
            StackSym * byteCodeUseSym = stackSym;
            if (byteCodeUseSym->IsTypeSpec())
            {
                // It has to have a var version for byte code regs
                byteCodeUseSym = byteCodeUseSym->GetVarEquivSym(nullptr);
            }

            block->byteCodeUpwardExposedUsed->Set(byteCodeUseSym->m_id);
#if DBG
            // We can only track first level function stack syms right now
            if (byteCodeUseSym->GetByteCodeFunc() == this->func)
            {
                Js::RegSlot byteCodeRegSlot = byteCodeUseSym->GetByteCodeRegSlot();
                if (block->byteCodeRestoreSyms[byteCodeRegSlot] != byteCodeUseSym)
                {
                    AssertMsg(block->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr,
                        "Can't have two active lifetime for the same byte code register");
                    block->byteCodeRestoreSyms[byteCodeRegSlot] = byteCodeUseSym;
                }
            }
#endif
        }
    }

    if(IsCollectionPass())
    {
        return true;
    }

    if (this->DoMarkTempNumbers())
    {
        Assert((block->loop != nullptr) == block->tempNumberTracker->HasTempTransferDependencies());
        block->tempNumberTracker->ProcessUse(stackSym, this);
    }
    if (this->DoMarkTempObjects())
    {
        Assert((block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies());
        block->tempObjectTracker->ProcessUse(stackSym, this);
    }
#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        Assert((block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies());
        block->tempObjectVerifyTracker->ProcessUse(stackSym, this);
    }
#endif
    return !!block->upwardExposedUses->TestAndSet(stackSym->m_id);
}